

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ModuleHeaderSyntax * __thiscall slang::parsing::Parser::parseModuleHeader(Parser *this)

{
  Token name;
  bool bVar1;
  int iVar2;
  SyntaxKind kind;
  undefined8 uVar3;
  PackageImportDeclarationSyntax *parameters;
  PackageImportDeclarationSyntax *ports;
  NonAnsiPortSyntax *pNVar4;
  undefined4 extraout_var;
  SourceLocation SVar5;
  ModuleHeaderSyntax *pMVar6;
  __extent_storage<18446744073709551615UL> _Var7;
  Info *pIVar8;
  Info *extraout_RDX;
  PackageImportDeclarationSyntax *this_00;
  TokenKind TVar9;
  TokenKind TVar10;
  ulong uVar11;
  Token TVar12;
  Token TVar13;
  span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> sVar14;
  Token TVar15;
  Token TVar16;
  SourceRange range;
  Token moduleKeyword;
  Token lifetime;
  Info *local_1f0;
  EVP_PKEY_CTX *local_1e8;
  Token local_1d0;
  pointer local_1c0;
  Info *local_1b8;
  undefined8 local_1b0;
  Info *local_1a8;
  undefined8 local_1a0;
  Info *local_198;
  Token local_190;
  undefined8 local_180;
  Info *pIStack_178;
  Token local_170;
  Token local_160;
  Token current;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_140;
  ulong local_130;
  undefined8 uStack_128;
  undefined8 local_118;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  
  TVar12 = ParserBase::consume(&this->super_ParserBase);
  local_198 = TVar12.info;
  uVar3 = TVar12._0_8_;
  TVar13 = parseLifetime(this);
  local_1a8 = TVar13.info;
  local_1a0 = TVar13._0_8_;
  TVar13 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_1b8 = TVar13.info;
  local_1b0 = TVar13._0_8_;
  sVar14 = parsePackageImports(this);
  _Var7 = sVar14._M_extent._M_extent_value;
  local_1c0 = sVar14._M_ptr;
  parameters = (PackageImportDeclarationSyntax *)parseParameterPortList(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    TVar13 = ParserBase::consume(&this->super_ParserBase);
    bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
    if ((bVar1) && (TVar15 = ParserBase::peek(&this->super_ParserBase,1), TVar15.kind == Star)) {
      TVar15 = ParserBase::consume(&this->super_ParserBase);
      local_160 = ParserBase::consume(&this->super_ParserBase);
      local_170 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      ports = (PackageImportDeclarationSyntax *)
              slang::syntax::SyntaxFactory::wildcardPortList
                        (&this->factory,TVar13,TVar15,local_160,local_170);
    }
    else {
      bVar1 = isNonAnsiPort(this);
      if (bVar1) {
        Token::Token(&local_1d0);
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
             (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
        TVar15 = ParserBase::peek(&this->super_ParserBase);
        current = TVar15;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar15.kind);
        if (bVar1) {
          bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
          if (!bVar1) {
            SVar5 = Token::location(&current);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x480005,SVar5);
          }
          local_1d0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_003c6092:
          pIVar8 = local_1d0.info;
        }
        else {
          bVar1 = slang::syntax::SyntaxFacts::isPossibleNonAnsiPort(TVar15.kind);
          if (bVar1) {
            do {
              do {
                local_1f0 = TVar15.info;
                pNVar4 = parseNonAnsiPort(this);
                local_140._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar4;
                local_130 = CONCAT71(local_130._1_7_,1);
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                           (TokenOrSyntax *)&local_140._M_first);
                TVar16 = ParserBase::peek(&this->super_ParserBase);
                TVar9 = TVar16.kind;
                bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9);
                if (TVar9 == EndOfFile || bVar1) goto LAB_003c6087;
                if (TVar9 != Comma) {
                  ParserBase::expect(&this->super_ParserBase,Comma);
                  do {
                    bVar1 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleNonAnsiPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                      (&this->super_ParserBase,(DiagCode)0x480005,false);
                    if (!bVar1) {
                      local_1d0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                      goto LAB_003c6092;
                    }
                    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
                  } while (!bVar1);
                }
                local_140._M_first._M_storage =
                     (_Uninitialized<slang::parsing::Token,_true>)
                     ParserBase::expect(&this->super_ParserBase,Comma);
                local_130 = local_130 & 0xffffffffffffff00;
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                           (TokenOrSyntax *)&local_140._M_first);
                TVar16 = ParserBase::peek(&this->super_ParserBase);
                pIVar8 = TVar16.info;
                TVar9 = TVar16.kind;
                bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9);
                if (TVar9 == EndOfFile || bVar1) {
                  pNVar4 = parseNonAnsiPort(this);
                  local_140._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar4;
                  local_130 = CONCAT71(local_130._1_7_,1);
                  SmallVectorBase<slang::syntax::TokenOrSyntax>::
                  emplace_back<slang::syntax::TokenOrSyntax>
                            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                             (TokenOrSyntax *)&local_140._M_first);
                  goto LAB_003c6087;
                }
                TVar10 = TVar15.kind;
                uVar11 = TVar16._0_8_ & 0xffffffff;
                TVar15.info = pIVar8;
                TVar15.kind = (short)uVar11;
                TVar15._2_1_ = (char)(uVar11 >> 0x10);
                TVar15.numFlags.raw = (char)(uVar11 >> 0x18);
                TVar15.rawLen = (int)(uVar11 >> 0x20);
              } while (local_1f0 != pIVar8 || TVar10 != TVar9);
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleNonAnsiPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x480005,true);
              uVar11 = TVar16._0_8_ & 0xffffffff;
              TVar15.kind = (short)uVar11;
              TVar15._2_1_ = (char)(uVar11 >> 0x10);
              TVar15.numFlags.raw = (char)(uVar11 >> 0x18);
              TVar15.rawLen = (int)(uVar11 >> 0x20);
            } while (bVar1);
LAB_003c6087:
            local_1d0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
            goto LAB_003c6092;
          }
          ParserBase::reportMissingList
                    (&this->super_ParserBase,TVar15,CloseParenthesis,&local_1d0,(DiagCode)0x480005);
          pIVar8 = extraout_RDX;
        }
        iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar8);
        local_118 = CONCAT44(extraout_var,iVar2);
        local_140._8_4_ = 3;
        local_130 = 0;
        uStack_128 = 0;
        local_140._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00679c88;
        local_1e8 = TVar13._0_8_;
        ports = (PackageImportDeclarationSyntax *)
                slang::syntax::SyntaxFactory::nonAnsiPortList
                          (&this->factory,TVar13,
                           (SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)
                           &local_140._M_first,local_1d0);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,local_1e8);
      }
      else {
        ports = (PackageImportDeclarationSyntax *)parseAnsiPortList(this,TVar13);
      }
    }
  }
  else {
    ports = (PackageImportDeclarationSyntax *)0x0;
  }
  if (TVar12.kind == PackageKeyword) {
    if (_Var7._M_extent_value == 0) {
      this_00 = parameters;
      if ((parameters == (PackageImportDeclarationSyntax *)0x0) &&
         (this_00 = ports, ports == (PackageImportDeclarationSyntax *)0x0)) goto LAB_003c618a;
    }
    else {
      this_00 = *local_1c0;
    }
    range = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x700005,range);
  }
  else if ((parameters == (PackageImportDeclarationSyntax *)0x0 &&
           ports == (PackageImportDeclarationSyntax *)0x0) && _Var7._M_extent_value != 0) {
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
         ParserBase::peek(&this->super_ParserBase);
    SVar5 = Token::location((Token *)&buffer);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4e0005,SVar5);
  }
LAB_003c618a:
  TVar13 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  kind = slang::syntax::SyntaxFacts::getModuleHeaderKind(TVar12.kind);
  local_180 = local_1b0;
  pIStack_178 = local_1b8;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._0_4_ = 1;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._16_8_ = local_1c0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)&PTR_getChild_00679c00
  ;
  name.info = local_1b8;
  name.kind = (undefined2)local_1b0;
  name._2_1_ = local_1b0._2_1_;
  name.numFlags.raw = local_1b0._3_1_;
  name.rawLen = local_1b0._4_4_;
  moduleKeyword.info = local_198;
  moduleKeyword.kind = (short)uVar3;
  moduleKeyword._2_1_ = (char)((ulong)uVar3 >> 0x10);
  moduleKeyword.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  moduleKeyword.rawLen = (int)((ulong)uVar3 >> 0x20);
  lifetime.info = local_1a8;
  lifetime.kind = (undefined2)local_1a0;
  lifetime._2_1_ = local_1a0._2_1_;
  lifetime.numFlags.raw = local_1a0._3_1_;
  lifetime.rawLen = local_1a0._4_4_;
  local_190 = TVar13;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._8_8_ =
       _Var7._M_extent_value;
  buffer.stackBase._0_8_ = _Var7._M_extent_value;
  pMVar6 = slang::syntax::SyntaxFactory::moduleHeader
                     (&this->factory,kind,moduleKeyword,lifetime,name,
                      (SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)&buffer,
                      (ParameterPortListSyntax *)parameters,(PortListSyntax *)ports,TVar13);
  return pMVar6;
}

Assistant:

ModuleHeaderSyntax& Parser::parseModuleHeader() {
    auto moduleKeyword = consume();
    auto lifetime = parseLifetime();
    auto name = expect(TokenKind::Identifier);
    auto imports = parsePackageImports();
    auto parameterList = parseParameterPortList();

    PortListSyntax* ports = nullptr;
    if (peek(TokenKind::OpenParenthesis)) {
        auto openParen = consume();
        if (peek(TokenKind::Dot) && peek(1).kind == TokenKind::Star) {
            auto dot = consume();
            auto star = consume();
            ports = &factory.wildcardPortList(openParen, dot, star,
                                              expect(TokenKind::CloseParenthesis));
        }
        else if (isNonAnsiPort()) {
            Token closeParen;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleNonAnsiPort, isEndOfParenList>(
                buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen,
                RequireItems::True, diag::ExpectedNonAnsiPort,
                [this] { return &parseNonAnsiPort(); }, AllowEmpty::True);
            ports = &factory.nonAnsiPortList(openParen, buffer.copy(alloc), closeParen);
        }
        else {
            ports = &parseAnsiPortList(openParen);
        }
    }

    if (moduleKeyword.kind == TokenKind::PackageKeyword) {
        std::optional<SourceRange> errorRange;
        if (!imports.empty())
            errorRange = imports[0]->sourceRange();
        else if (parameterList)
            errorRange = parameterList->sourceRange();
        else if (ports)
            errorRange = ports->sourceRange();

        if (errorRange)
            addDiag(diag::InvalidPackageDecl, *errorRange);
    }
    else if (!imports.empty() && !parameterList && !ports) {
        addDiag(diag::ExpectedPortList, peek().location());
    }

    auto semi = expect(TokenKind::Semicolon);
    return factory.moduleHeader(getModuleHeaderKind(moduleKeyword.kind), moduleKeyword, lifetime,
                                name, imports, parameterList, ports, semi);
}